

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double log_series_pdf(int x,double a)

{
  __type _Var1;
  double dVar2;
  undefined8 local_20;
  double pdf;
  double a_local;
  int x_local;
  
  if (x < 1) {
    local_20 = 0.0;
  }
  else {
    _Var1 = std::pow<double,int>(a,x);
    dVar2 = log(1.0 - a);
    local_20 = -_Var1 / ((double)x * dVar2);
  }
  return local_20;
}

Assistant:

double log_series_pdf ( int x, double a )

//****************************************************************************80
//
//  Purpose:
//
//    LOG_SERIES_PDF evaluates the Logarithmic Series PDF.
//
//  Discussion:
//
//    PDF(A;X) = - A^X / ( X * log ( 1 - A ) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int X, the argument of the PDF.
//    0 < X
//
//    Input, double A, the parameter of the PDF.
//    0.0 < A < 1.0.
//
//    Output, double LOG_SERIES_PDF, the value of the PDF.
//
{
  double pdf;

  if ( x <= 0 )
  {
    pdf = 0.0;
  }
  else
  {
    pdf = - pow ( a, x ) / ( static_cast<double>(x ) * log ( 1.0 - a ) );
  }
  return pdf;
}